

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lipm-dcm-estimator.cpp
# Opt level: O0

void __thiscall stateObservation::LipmDcmEstimator::update(LipmDcmEstimator *this)

{
  Scalar *pSVar1;
  Scalar *pSVar2;
  double dVar3;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_e0;
  Product<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_0>
  local_c8;
  undefined1 local_a8 [16];
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Product<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_0>_>
  local_98;
  Vector2 local_68;
  Product<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> local_58;
  Vector2 local_48;
  undefined1 local_38 [8];
  Vector2 clampedLocalBias;
  Vector2 localBias;
  LipmDcmEstimator *this_local;
  
  updateMatricesABQ_(this);
  ZeroDelayObserver::estimateState((ZeroDelayObserver *)&this->filter_);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::x
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)&this->biasLimit_)
  ;
  if ((*pSVar1 < 0.0) &&
     (pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y
                         ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                          &this->biasLimit_), *pSVar1 < 0.0)) {
    return;
  }
  getLocalBias((LipmDcmEstimator *)
               (clampedLocalBias.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                m_storage.m_data.array + 1));
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix((Matrix<double,_2,_1,_0,_2,_1> *)local_38);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::x
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)&this->biasLimit_)
  ;
  if (0.0 <= *pSVar1) {
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::x
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                        (clampedLocalBias.
                         super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                         m_data.array + 1));
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::x
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                        &this->biasLimit_);
    dVar3 = tools::clampScalar<double>(pSVar1,pSVar2);
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::x
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)local_38);
    *pSVar1 = dVar3;
  }
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)&this->biasLimit_)
  ;
  if (0.0 <= *pSVar1) {
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                        (clampedLocalBias.
                         super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                         m_data.array + 1));
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                        &this->biasLimit_);
    dVar3 = tools::clampScalar<double>(pSVar1,pSVar2);
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)local_38);
    *pSVar1 = dVar3;
  }
  local_58 = Eigen::MatrixBase<Eigen::Matrix<double,2,2,0,2,2>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,2,2,0,2,2>> *)&this->previousOrientation_,
                        (MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_38);
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,2,2,0,2,2>,Eigen::Matrix<double,2,1,0,2,1>,0>>
            ((Matrix<double,2,1,0,2,1> *)&local_48,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>_>
              *)&local_58);
  setBias(this,&local_48);
  getUnbiasedDCM((LipmDcmEstimator *)local_a8);
  Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator-
            (&local_e0,
             (MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)
             (clampedLocalBias.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
              m_storage.m_data.array + 1),
             (MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_38);
  Eigen::MatrixBase<Eigen::Matrix<double,2,2,0,2,2>>::operator*
            (&local_c8,(MatrixBase<Eigen::Matrix<double,2,2,0,2,2>> *)&this->previousOrientation_,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)&local_e0);
  Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator+
            ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Product<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_0>_>
              *)(local_a8 + 0x10),(MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)local_a8,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_0>_>
              *)&local_c8);
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::Product<Eigen::Matrix<double,2,2,0,2,2>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::Matrix<double,2,1,0,2,1>const>,0>const>>
            ((Matrix<double,2,1,0,2,1> *)&local_68,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Product<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_0>_>_>
              *)(local_a8 + 0x10));
  setUnbiasedDCM(this,&local_68);
  return;
}

Assistant:

void LipmDcmEstimator::update()
{
  updateMatricesABQ_();
  filter_.estimateState();
  if(biasLimit_.x() >= 0 || biasLimit_.y() >= 0)
  {
    Vector2 localBias = getLocalBias();
    Vector2 clampedLocalBias;
    if(biasLimit_.x() >= 0)
    {
      clampedLocalBias.x() = tools::clampScalar(localBias.x(), biasLimit_.x());
    }
    if(biasLimit_.y() >= 0)
    {
      clampedLocalBias.y() = tools::clampScalar(localBias.y(), biasLimit_.y());
    }

    setBias(previousOrientation_ * clampedLocalBias);
    setUnbiasedDCM(getUnbiasedDCM() + previousOrientation_ * (localBias - clampedLocalBias));
  }
}